

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

void __thiscall chrono::collision::ChCollisionSystemBullet::Clear(ChCollisionSystemBullet *this)

{
  cbtDispatcher *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  
  uVar2 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[9])();
  for (uVar4 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar4; uVar4 = uVar4 + 1) {
    pcVar1 = this->bt_collision_world->m_dispatcher1;
    iVar3 = (*pcVar1->_vptr_cbtDispatcher[10])(pcVar1,(ulong)uVar4);
    cbtPersistentManifold::clearManifold((cbtPersistentManifold *)CONCAT44(extraout_var,iVar3));
  }
  return;
}

Assistant:

void ChCollisionSystemBullet::Clear(void) {
    int numManifolds = bt_collision_world->getDispatcher()->getNumManifolds();
    for (int i = 0; i < numManifolds; i++) {
        cbtPersistentManifold* contactManifold = bt_collision_world->getDispatcher()->getManifoldByIndexInternal(i);
        contactManifold->clearManifold();
    }
}